

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

float trng::math::detail::inv_GammaP<float>(float a,float p)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  float in_XMM0_Da;
  float fVar4;
  float fVar5;
  float fVar6;
  float extraout_XMM0_Da;
  double dVar7;
  undefined1 auVar8 [16];
  float in_XMM1_Da;
  float u;
  float t_2;
  float err;
  int i;
  float t_1;
  float t;
  float pp;
  float x;
  float afac;
  float lna1;
  float glna;
  float a1;
  float eps;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float local_64;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  int local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  undefined1 extraout_var [12];
  
  local_8 = in_XMM1_Da;
  local_4 = in_XMM0_Da;
  auVar8._0_4_ = Catch::clara::std::numeric_limits<float>::epsilon();
  auVar8._4_12_ = extraout_var;
  dVar7 = std::sqrt(auVar8._0_8_);
  local_c = SUB84(dVar7,0);
  local_10 = local_4 - 1.0;
  local_14 = ln_Gamma(0.0);
  local_18 = ln(0.0);
  dVar7 = std::exp((double)(ulong)(uint)(local_10 * (local_18 - 1.0) + -local_14));
  local_1c = SUB84(dVar7,0);
  if (local_4 <= 1.0) {
    local_34 = -local_4 * (local_4 * 0.12 + 0.253) + 1.0;
    if (local_34 <= local_8) {
      local_64 = ln1p(0.0);
      local_64 = 1.0 - local_64;
    }
    else {
      dVar7 = std::pow((double)(ulong)(uint)(local_8 / local_34),
                       (double)(ulong)(uint)(1.0 / local_4));
      local_64 = SUB84(dVar7,0);
    }
    local_20 = local_64;
  }
  else {
    if (0.5 <= local_8) {
      local_50 = 1.0 - local_8;
    }
    else {
      local_50 = local_8;
    }
    local_24 = local_50;
    fVar4 = ln(0.0);
    dVar7 = std::sqrt((double)(ulong)(uint)(fVar4 * -2.0));
    local_30 = local_4;
    local_28 = SUB84(dVar7,0);
    local_54 = (local_28 * 0.27061 + 2.30753) / (local_28 * (local_28 * 0.04481 + 0.99229) + 1.0) -
               local_28;
    if (local_8 < 0.5) {
      local_54 = -local_54;
    }
    local_20 = local_54;
    local_2c = 0.001;
    fVar4 = local_4 * 9.0;
    dVar7 = std::sqrt((double)(ulong)(uint)local_4);
    dVar7 = std::pow((double)(ulong)(uint)((1.0 - 1.0 / fVar4) - local_54 / (SUB84(dVar7,0) * 3.0)),
                     5.32571209255933e-315);
    local_30 = local_30 * SUB84(dVar7,0);
    pfVar2 = utility::max<float>(&local_2c,&local_30);
    local_20 = *pfVar2;
  }
  local_38 = 0;
  while( true ) {
    if (0x17 < local_38) {
      return local_20;
    }
    if (local_20 <= 0.0) break;
    local_3c = GammaP<float,true>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    fVar1 = local_10;
    fVar4 = local_1c;
    local_3c = local_3c - local_8;
    if (local_4 <= 1.0) {
      fVar4 = -local_20;
      fVar5 = ln(0.0);
      dVar7 = std::exp((double)(ulong)(uint)((fVar1 * fVar5 + fVar4) - local_14));
      local_40 = SUB84(dVar7,0);
    }
    else {
      fVar5 = local_20 - local_10;
      fVar6 = ln(0.0);
      dVar7 = std::exp((double)(ulong)(uint)(fVar1 * (fVar6 - local_18) + -fVar5));
      local_40 = fVar4 * SUB84(dVar7,0);
    }
    fVar4 = local_3c / local_40;
    local_48 = 1.0;
    local_4c = fVar4 * ((local_4 - 1.0) / local_20 - 1.0);
    pfVar2 = &local_48;
    local_44 = fVar4;
    pfVar3 = utility::min<float>(pfVar2,&local_4c);
    local_40 = fVar4 / (1.0 - *pfVar3 / 2.0);
    in_stack_ffffffffffffff80 = local_20 - local_40;
    if (in_stack_ffffffffffffff80 <= 0.0) {
      in_stack_ffffffffffffff80 = (in_stack_ffffffffffffff80 + local_40) / 2.0;
    }
    local_20 = in_stack_ffffffffffffff80;
    Catch::clara::std::abs((int)pfVar2);
    if (extraout_XMM0_Da < local_c * local_20) {
      return local_20;
    }
    local_38 = local_38 + 1;
  }
  return 0.0;
}

Assistant:

TRNG_CUDA_ENABLE T inv_GammaP(T a, T p) {
        const T eps{sqrt(numeric_limits<T>::epsilon())};
        const T a1{a - 1};
        const T glna{ln_Gamma(a)};
        const T lna1{ln(a1)};
        const T afac{exp(a1 * (lna1 - 1) - glna)};
        T x;
        // initial guess
        if (a > T{1}) {
          const T pp{p < T{1} / T{2} ? p : 1 - p};
          const T t{sqrt(-2 * ln(pp))};
          x = (T{2.30753} + t * T{0.27061}) / (1 + t * (T{0.99229} + t * T{0.04481})) - t;
          x = p < T{1} / T{2} ? -x : x;
          x = utility::max(T{1} / T{1000}, a * pow(1 - 1 / (9 * a) - x / (3 * sqrt(a)), T{3}));
        } else {
          const T t{1 - a * (T{0.253} + a * T{0.12})};
          x = p < t ? pow(p / t, 1 / a) : 1 - ln1p(-(p - t) / (1 - t));
        }
        // refinement by Halley's method
        for (int i{0}; i < numeric_limits<T>::digits; ++i) {
          if (x <= 0) {
            x = 0;
            break;
          }
          const T err{GammaP<T, true>(a, x) - p};
          T t;
          if (a > 1)
            t = afac * exp(-(x - a1) + a1 * (ln(x) - lna1));
          else
            t = exp(-x + a1 * ln(x) - glna);
          const T u{err / t};
          t = u / (1 - utility::min(T{1}, u * ((a - 1) / x - 1)) / 2);
          x -= t;
          x = x <= 0 ? (x + t) / 2 : x;
          if (abs(t) < eps * x)
            break;
        }
        return x;
      }